

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void disas_ldst_ldapr_stlr(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  bool bVar1;
  _Bool _Var2;
  uint32_t iss_srt;
  uint32_t reg;
  int32_t iVar3;
  uint32_t opc_00;
  uint32_t size_00;
  TCGv_i64 pTVar4;
  TCGv_i64 pTVar5;
  _Bool local_4b;
  _Bool local_4a;
  _Bool iss_sf;
  _Bool extend;
  _Bool is_signed;
  _Bool is_store;
  TCGv_i64 dirty_addr;
  TCGv_i64 clean_addr;
  int size;
  int opc;
  int offset;
  int rn;
  int rt;
  TCGContext_conflict1 *tcg_ctx;
  uint32_t insn_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  iss_srt = extract32(insn,0,5);
  reg = extract32(insn,5,5);
  iVar3 = sextract32(insn,0xc,9);
  opc_00 = extract32(insn,0x16,2);
  size_00 = extract32(insn,0x1e,2);
  bVar1 = false;
  local_4a = false;
  local_4b = false;
  _Var2 = isar_feature_aa64_rcpc_8_4(s->isar);
  if (_Var2) {
    switch(opc_00) {
    case 0:
      bVar1 = true;
      break;
    case 1:
      break;
    case 2:
      if (size_00 == 3) {
        unallocated_encoding_aarch64(s);
        return;
      }
      local_4a = true;
      break;
    case 3:
      if (1 < (int)size_00) {
        unallocated_encoding_aarch64(s);
        return;
      }
      local_4a = true;
      local_4b = true;
      break;
    default:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                 ,0xda0,(char *)0x0);
    }
    _Var2 = disas_ldst_compute_iss_sf(size_00,local_4a,opc_00);
    if (reg == 0x1f) {
      gen_check_sp_alignment(s);
    }
    pTVar4 = read_cpu_reg_sp_aarch64(s,reg,1);
    tcg_gen_addi_i64_aarch64(tcg_ctx_00,pTVar4,pTVar4,(long)iVar3);
    pTVar4 = clean_data_tbi(s,pTVar4);
    if (bVar1) {
      tcg_gen_mb_aarch64(tcg_ctx_00,TCG_BAR_STRL|TCG_MO_ALL);
      pTVar5 = cpu_reg_aarch64(s,iss_srt);
      do_gpr_st(s,pTVar5,pTVar4,size_00,true,iss_srt,_Var2,true);
    }
    else {
      pTVar5 = cpu_reg_aarch64(s,iss_srt);
      do_gpr_ld(s,pTVar5,pTVar4,size_00,local_4a,local_4b,true,iss_srt,_Var2,true);
      tcg_gen_mb_aarch64(tcg_ctx_00,TCG_BAR_LDAQ|TCG_MO_ALL);
    }
  }
  else {
    unallocated_encoding_aarch64(s);
  }
  return;
}

Assistant:

static void disas_ldst_ldapr_stlr(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int rt = extract32(insn, 0, 5);
    int rn = extract32(insn, 5, 5);
    int offset = sextract32(insn, 12, 9);
    int opc = extract32(insn, 22, 2);
    int size = extract32(insn, 30, 2);
    TCGv_i64 clean_addr, dirty_addr;
    bool is_store = false;
    bool is_signed = false;
    bool extend = false;
    bool iss_sf;

    if (!dc_isar_feature(aa64_rcpc_8_4, s)) {
        unallocated_encoding(s);
        return;
    }

    switch (opc) {
    case 0: /* STLURB */
        is_store = true;
        break;
    case 1: /* LDAPUR* */
        break;
    case 2: /* LDAPURS* 64-bit variant */
        if (size == 3) {
            unallocated_encoding(s);
            return;
        }
        is_signed = true;
        break;
    case 3: /* LDAPURS* 32-bit variant */
        if (size > 1) {
            unallocated_encoding(s);
            return;
        }
        is_signed = true;
        extend = true; /* zero-extend 32->64 after signed load */
        break;
    default:
        g_assert_not_reached();
    }

    iss_sf = disas_ldst_compute_iss_sf(size, is_signed, opc);

    if (rn == 31) {
        gen_check_sp_alignment(s);
    }

    dirty_addr = read_cpu_reg_sp(s, rn, 1);
    tcg_gen_addi_i64(tcg_ctx, dirty_addr, dirty_addr, offset);
    clean_addr = clean_data_tbi(s, dirty_addr);

    if (is_store) {
        /* Store-Release semantics */
        tcg_gen_mb(tcg_ctx, TCG_MO_ALL | TCG_BAR_STRL);
        do_gpr_st(s, cpu_reg(s, rt), clean_addr, size, true, rt, iss_sf, true);
    } else {
        /*
         * Load-AcquirePC semantics; we implement as the slightly more
         * restrictive Load-Acquire.
         */
        do_gpr_ld(s, cpu_reg(s, rt), clean_addr, size, is_signed, extend,
                  true, rt, iss_sf, true);
        tcg_gen_mb(tcg_ctx, TCG_MO_ALL | TCG_BAR_LDAQ);
    }
}